

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O1

void __thiscall
HandleInfoBase<XrGeometryInstanceFB_T_*,_GenValidUsageXrHandleInfo>::erase
          (HandleInfoBase<XrGeometryInstanceFB_T_*,_GenValidUsageXrHandleInfo> *this,
          XrGeometryInstanceFB_T *handle)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  UniqueLock lock;
  XrGeometryInstanceFB_T *local_48;
  string local_40;
  unique_lock<std::mutex> local_20;
  
  local_48 = handle;
  if (handle == (XrGeometryInstanceFB_T *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Null handle passed to HandleInfoBase::erase()","");
    reportInternalError(&local_40);
  }
  local_20._M_device = &this->dispatch_mutex_;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  uVar1 = (this->info_map_)._M_h._M_bucket_count;
  uVar3 = (ulong)local_48 % uVar1;
  p_Var4 = (this->info_map_)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4,
     local_48 != (XrGeometryInstanceFB_T *)p_Var4->_M_nxt[1]._M_nxt)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, local_48 == (XrGeometryInstanceFB_T *)p_Var2[1]._M_nxt))
      goto LAB_002ccce6;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_002ccce6:
  if ((p_Var5 != (__node_base_ptr)0x0) && (p_Var5->_M_nxt != (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<XrGeometryInstanceFB_T_*,_std::pair<XrGeometryInstanceFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrGeometryInstanceFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrGeometryInstanceFB_T_*>,_std::hash<XrGeometryInstanceFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<XrGeometryInstanceFB_T_*,_std::pair<XrGeometryInstanceFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrGeometryInstanceFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrGeometryInstanceFB_T_*>,_std::hash<XrGeometryInstanceFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,&local_48);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Handle passed to HandleInfoBase::insert() not inserted","");
  reportInternalError(&local_40);
}

Assistant:

inline void HandleInfoBase<HandleType, InfoType>::erase(HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::erase()");
    }
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned == info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() not inserted");
    }
    info_map_.erase(handle);
}